

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

int __thiscall
Centaurus::NFA<unsigned_char>::select
          (NFA<unsigned_char> *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  int extraout_EAX;
  NFABaseState<unsigned_char,_int> *pNVar1;
  undefined4 in_register_00000034;
  long lVar2;
  int iVar3;
  NFABaseState<unsigned_char,_int> local_58;
  
  lVar2 = CONCAT44(in_register_00000034,__nfds);
  pNVar1 = (this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
           super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58._vptr_NFABaseState = (_func_int **)&PTR__CharClass_0019f4e0;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = (int)(((long)(this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
                       super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) / 0x28);
  NFABaseState<unsigned_char,_int>::add_transition
            (pNVar1,(CharClass<unsigned_char> *)&local_58,iVar3,false);
  CharClass<unsigned_char>::~CharClass((CharClass<unsigned_char> *)&local_58);
  pNVar1 = *(NFABaseState<unsigned_char,_int> **)(lVar2 + 8);
  iVar3 = iVar3 + -1;
  while (pNVar1 = pNVar1 + 1, pNVar1 != *(NFABaseState<unsigned_char,_int> **)(lVar2 + 0x10)) {
    NFABaseState<unsigned_char,_int>::offset(&local_58,pNVar1,iVar3);
    std::
    vector<Centaurus::NFABaseState<unsigned_char,int>,std::allocator<Centaurus::NFABaseState<unsigned_char,int>>>
    ::emplace_back<Centaurus::NFABaseState<unsigned_char,int>>
              ((vector<Centaurus::NFABaseState<unsigned_char,int>,std::allocator<Centaurus::NFABaseState<unsigned_char,int>>>
                *)&(this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states,
               &local_58);
    NFABaseState<unsigned_char,_int>::~NFABaseState(&local_58);
  }
  NFABaseState<unsigned_char,_int>::rebase_transitions
            ((this->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>).m_states.
             super__Vector_base<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             *(NFABaseState<unsigned_char,_int> **)(lVar2 + 8),iVar3);
  local_58._vptr_NFABaseState = (_func_int **)&PTR__CharClass_0019f4e0;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  add_state(this,(CharClass<unsigned_char> *)&local_58);
  CharClass<unsigned_char>::~CharClass((CharClass<unsigned_char> *)&local_58);
  local_58._vptr_NFABaseState = (_func_int **)&PTR__CharClass_0019f4e0;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_transitions.
  super__Vector_base<Centaurus::NFATransition<unsigned_char>,_std::allocator<Centaurus::NFATransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  add_transition_from(this,(CharClass<unsigned_char> *)&local_58,iVar3);
  CharClass<unsigned_char>::~CharClass((CharClass<unsigned_char> *)&local_58);
  return extraout_EAX;
}

Assistant:

CharClass(Stream& stream)
    {
        parse(stream);
    }